

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_gamemtls_lib.cxx
# Opt level: O1

void __thiscall xray_re::xr_gamemtls_lib::load(xr_gamemtls_lib *this,xr_reader *r)

{
  pointer *pppxVar1;
  pointer *pppxVar2;
  uint32_t *puVar3;
  iterator __position;
  iterator __position_00;
  size_t sVar4;
  xr_reader *pxVar5;
  uint32_t uVar6;
  xr_reader *s;
  uint16_t version;
  xr_gamemtl *material;
  xr_reader *local_58;
  short local_4a;
  xr_gamemtlpair *local_48;
  xr_reader *local_40;
  xr_reader *local_38;
  
  sVar4 = xr_reader::r_raw_chunk(r,0x1000,&local_4a,2);
  if (sVar4 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_gamemtls_lib.cxx"
                  ,0x5b,"void xray_re::xr_gamemtls_lib::load(xr_reader &)");
  }
  if (local_4a == 1) {
    sVar4 = xr_reader::find_chunk(r,0x1001);
    if (sVar4 != 0) {
      puVar3 = (r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(puVar3 + 1);
      this->m_material_index = *puVar3;
      puVar3 = (r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(puVar3 + 1);
      this->m_material_pair_index = *puVar3;
      local_58 = xr_reader::open_chunk(r,0x1002);
      local_38 = r;
      if (local_58 != (xr_reader *)0x0) {
        pxVar5 = xr_reader::open_chunk(local_58,0);
        local_40 = pxVar5;
        if (pxVar5 != (xr_reader *)0x0) {
          uVar6 = 1;
          do {
            local_40 = pxVar5;
            local_48 = (xr_gamemtlpair *)operator_new(0x78);
            *(string **)&local_48->id = &local_48->breaking_sounds;
            *(undefined8 *)&local_48->own_props = 0;
            *(undefined1 *)&(local_48->breaking_sounds)._M_dataplus._M_p = 0;
            (local_48->breaking_sounds).field_2._M_allocated_capacity =
                 (size_type)&local_48->step_sounds;
            *(undefined8 *)((long)&(local_48->breaking_sounds).field_2 + 8) = 0;
            *(undefined1 *)&(local_48->step_sounds)._M_dataplus._M_p = 0;
            xr_gamemtl::load((xr_gamemtl *)local_48,pxVar5);
            __position._M_current =
                 (this->m_materials).
                 super__Vector_base<xray_re::xr_gamemtl_*,_std::allocator<xray_re::xr_gamemtl_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (this->m_materials).
                super__Vector_base<xray_re::xr_gamemtl_*,_std::allocator<xray_re::xr_gamemtl_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<xray_re::xr_gamemtl*,std::allocator<xray_re::xr_gamemtl*>>::
              _M_realloc_insert<xray_re::xr_gamemtl*const&>
                        ((vector<xray_re::xr_gamemtl*,std::allocator<xray_re::xr_gamemtl*>> *)
                         &this->m_materials,__position,(xr_gamemtl **)&local_48);
            }
            else {
              *__position._M_current = (xr_gamemtl *)local_48;
              pppxVar1 = &(this->m_materials).
                          super__Vector_base<xray_re::xr_gamemtl_*,_std::allocator<xray_re::xr_gamemtl_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              *pppxVar1 = *pppxVar1 + 1;
            }
            xr_reader::close_chunk(local_58,&local_40);
            pxVar5 = xr_reader::open_chunk(local_58,uVar6);
            uVar6 = uVar6 + 1;
            local_40 = pxVar5;
          } while (pxVar5 != (xr_reader *)0x0);
        }
        r = local_38;
        xr_reader::close_chunk(local_38,&local_58);
      }
      local_58 = xr_reader::open_chunk(r,0x1003);
      if (local_58 != (xr_reader *)0x0) {
        pxVar5 = xr_reader::open_chunk(local_58,0);
        local_40 = pxVar5;
        if (pxVar5 != (xr_reader *)0x0) {
          uVar6 = 1;
          do {
            local_40 = pxVar5;
            local_48 = (xr_gamemtlpair *)operator_new(0xb8);
            (local_48->breaking_sounds)._M_dataplus._M_p =
                 (pointer)&(local_48->breaking_sounds).field_2;
            (local_48->breaking_sounds)._M_string_length = 0;
            (local_48->breaking_sounds).field_2._M_local_buf[0] = '\0';
            (local_48->step_sounds)._M_dataplus._M_p = (pointer)&(local_48->step_sounds).field_2;
            (local_48->step_sounds)._M_string_length = 0;
            (local_48->step_sounds).field_2._M_local_buf[0] = '\0';
            (local_48->collide_sounds)._M_dataplus._M_p =
                 (pointer)&(local_48->collide_sounds).field_2;
            (local_48->collide_sounds)._M_string_length = 0;
            (local_48->collide_sounds).field_2._M_local_buf[0] = '\0';
            (local_48->collide_particles)._M_dataplus._M_p =
                 (pointer)&(local_48->collide_particles).field_2;
            (local_48->collide_particles)._M_string_length = 0;
            (local_48->collide_particles).field_2._M_local_buf[0] = '\0';
            (local_48->collide_marks)._M_dataplus._M_p = (pointer)&(local_48->collide_marks).field_2
            ;
            (local_48->collide_marks)._M_string_length = 0;
            (local_48->collide_marks).field_2._M_local_buf[0] = '\0';
            xr_gamemtlpair::load(local_48,pxVar5);
            __position_00._M_current =
                 (this->m_material_pairs).
                 super__Vector_base<xray_re::xr_gamemtlpair_*,_std::allocator<xray_re::xr_gamemtlpair_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (__position_00._M_current ==
                (this->m_material_pairs).
                super__Vector_base<xray_re::xr_gamemtlpair_*,_std::allocator<xray_re::xr_gamemtlpair_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<xray_re::xr_gamemtlpair*,std::allocator<xray_re::xr_gamemtlpair*>>::
              _M_realloc_insert<xray_re::xr_gamemtlpair*const&>
                        ((vector<xray_re::xr_gamemtlpair*,std::allocator<xray_re::xr_gamemtlpair*>>
                          *)&this->m_material_pairs,__position_00,&local_48);
            }
            else {
              *__position_00._M_current = local_48;
              pppxVar2 = &(this->m_material_pairs).
                          super__Vector_base<xray_re::xr_gamemtlpair_*,_std::allocator<xray_re::xr_gamemtlpair_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              *pppxVar2 = *pppxVar2 + 1;
            }
            xr_reader::close_chunk(local_58,&local_40);
            pxVar5 = xr_reader::open_chunk(local_58,uVar6);
            uVar6 = uVar6 + 1;
            local_40 = pxVar5;
          } while (pxVar5 != (xr_reader *)0x0);
        }
        xr_reader::close_chunk(local_38,&local_58);
      }
      return;
    }
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_gamemtls_lib.cxx"
                  ,0x5f,"void xray_re::xr_gamemtls_lib::load(xr_reader &)");
  }
  __assert_fail("version == GAMEMTLS_VERSION",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_gamemtls_lib.cxx"
                ,0x5c,"void xray_re::xr_gamemtls_lib::load(xr_reader &)");
}

Assistant:

void xr_gamemtls_lib::load(xr_reader& r)
{
	uint16_t version;
	if (!r.r_chunk<uint16_t>(GAMEMTLS_CHUNK_VERSION, version))
		xr_not_expected();
	xr_assert(version == GAMEMTLS_VERSION);

	if (!r.find_chunk(GAMEMTLS_CHUNK_AUTOINC))
		xr_not_expected();
	m_material_index = r.r_u32();
	m_material_pair_index = r.r_u32();
	r.debug_find_chunk();

	xr_reader* s = r.open_chunk(GAMEMTLS_CHUNK_MATERIALS);
	if (s) {
		xr_reader* f;
		for (uint32_t id = 0; (f = s->open_chunk(id)); ++id) {
			xr_gamemtl* material = new xr_gamemtl;
			material->load(*f);
			m_materials.push_back(material);
			s->close_chunk(f);
		}
		r.close_chunk(s);
	}
	s = r.open_chunk(GAMEMTLS_CHUNK_MATERIAL_PAIRS);
	if (s) {
		xr_reader* f;
		for (uint32_t id = 0; (f = s->open_chunk(id)); ++id) {
			xr_gamemtlpair* gamemtlpair = new xr_gamemtlpair;
			gamemtlpair->load(*f);
			m_material_pairs.push_back(gamemtlpair);
			s->close_chunk(f);
		}
		r.close_chunk(s);
	}
}